

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE
qpdf_oh_get_stream_data
          (qpdf_data qpdf,qpdf_oh stream_oh,qpdf_stream_decode_level_e decode_level,
          QPDF_BOOL *filtered,uchar **bufp,size_t *len)

{
  QPDF_ERROR_CODE QVar1;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(qpdf_oh *)local_58._M_unused._0_8_ = stream_oh;
  *(qpdf_stream_decode_level_e *)((long)local_58._M_unused._0_8_ + 4) = decode_level;
  *(QPDF_BOOL **)((long)local_58._M_unused._0_8_ + 8) = filtered;
  *(uchar ***)((long)local_58._M_unused._0_8_ + 0x10) = bufp;
  *(size_t **)((long)local_58._M_unused._0_8_ + 0x18) = len;
  pcStack_40 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1739:30)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1739:30)>
             ::_M_manager;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_oh_get_stream_data(
    qpdf_data qpdf,
    qpdf_oh stream_oh,
    qpdf_stream_decode_level_e decode_level,
    QPDF_BOOL* filtered,
    unsigned char** bufp,
    size_t* len)
{
    return trap_errors(qpdf, [stream_oh, decode_level, filtered, bufp, len](qpdf_data q) {
        auto stream = qpdf_oh_item_internal(q, stream_oh);
        Pipeline* p = nullptr;
        Pl_Buffer buf("stream data");
        if (bufp) {
            p = &buf;
        }
        bool was_filtered = false;
        if (stream.pipeStreamData(p, &was_filtered, 0, decode_level, false, false)) {
            QTC::TC("qpdf", "qpdf-c stream data buf set", bufp ? 0 : 1);
            if (p && bufp && len) {
                buf.getMallocBuffer(bufp, len);
            }
            QTC::TC("qpdf", "qpdf-c stream data filtered set", filtered ? 0 : 1);
            if (filtered) {
                *filtered = was_filtered ? QPDF_TRUE : QPDF_FALSE;
            }
        } else {
            throw std::runtime_error("unable to access stream data for stream " + stream.unparse());
        }
    });
}